

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

ssize_t google::ReadFromOffset(int fd,void *buf,size_t count,size_t offset)

{
  anon_class_32_4_f7029c84 run;
  ulong uVar1;
  ssize_t sVar2;
  undefined4 uStack_64;
  ssize_t len;
  size_t num_bytes;
  char *buf0;
  size_t offset_local;
  size_t count_local;
  void *buf_local;
  int fd_local;
  
  if (fd < 0) {
    abort();
  }
  uVar1 = std::numeric_limits<long>::max();
  if (uVar1 < count) {
    abort();
  }
  for (len = 0; (ulong)len < count; len = sVar2 + len) {
    run._4_4_ = uStack_64;
    run.fd = fd;
    run.p = (char *)((long)buf + len);
    run.n = count - len;
    run.m = offset + len;
    sVar2 = (anonymous_namespace)::
            FailureRetry<google::ReadFromOffset(int,void*,unsigned_long,unsigned_long)::__0>(run,4);
    if (sVar2 < 0) {
      return -1;
    }
    if (sVar2 == 0) break;
  }
  if ((ulong)len <= count) {
    return len;
  }
  abort();
}

Assistant:

static ssize_t ReadFromOffset(const int fd, void* buf, const size_t count,
                              const size_t offset) {
  GLOG_SAFE_ASSERT(fd >= 0);
  GLOG_SAFE_ASSERT(count <=
                   static_cast<size_t>(std::numeric_limits<ssize_t>::max()));
  char* buf0 = reinterpret_cast<char*>(buf);
  size_t num_bytes = 0;
  while (num_bytes < count) {
    ssize_t len = FailureRetry([fd, p = buf0 + num_bytes, n = count - num_bytes,
                                m = static_cast<off_t>(offset + num_bytes)] {
      return pread(fd, p, n, m);
    });
    if (len < 0) {  // There was an error other than EINTR.
      return -1;
    }
    if (len == 0) {  // Reached EOF.
      break;
    }
    num_bytes += static_cast<size_t>(len);
  }
  GLOG_SAFE_ASSERT(num_bytes <= count);
  return static_cast<ssize_t>(num_bytes);
}